

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonLabelCompare(char *zLeft,u32 nLeft,int rawLeft,char *zRight,u32 nRight,int rawRight)

{
  int iVar1;
  int rawRight_local;
  u32 nRight_local;
  char *zRight_local;
  int rawLeft_local;
  u32 nLeft_local;
  char *zLeft_local;
  
  if ((rawLeft == 0) || (rawRight == 0)) {
    zLeft_local._4_4_ = jsonLabelCompareEscaped(zLeft,nLeft,rawLeft,zRight,nRight,rawRight);
  }
  else if (nLeft == nRight) {
    iVar1 = memcmp(zLeft,zRight,(ulong)nLeft);
    zLeft_local._4_4_ = (uint)(iVar1 == 0);
  }
  else {
    zLeft_local._4_4_ = 0;
  }
  return zLeft_local._4_4_;
}

Assistant:

static int jsonLabelCompare(
  const char *zLeft,          /* The left label */
  u32 nLeft,                  /* Size of the left label in bytes */
  int rawLeft,                /* True if zLeft contains no escapes */
  const char *zRight,         /* The right label */
  u32 nRight,                 /* Size of the right label in bytes */
  int rawRight                /* True if zRight is escape-free */
){
  if( rawLeft && rawRight ){
    /* Simpliest case:  Neither label contains escapes.  A simple
    ** memcmp() is sufficient. */
    if( nLeft!=nRight ) return 0;
    return memcmp(zLeft, zRight, nLeft)==0;
  }else{
    return jsonLabelCompareEscaped(zLeft, nLeft, rawLeft,
                                   zRight, nRight, rawRight);
  }
}